

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Matchers::WithinAbsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinAbsMatcher *this)

{
  string local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  WithinAbsMatcher *local_18;
  WithinAbsMatcher *this_local;
  
  local_18 = this;
  this_local = (WithinAbsMatcher *)__return_storage_ptr__;
  Catch::Detail::stringify<double>(&local_78,&this->m_margin);
  std::operator+(&local_58,"is within ",&local_78);
  std::operator+(&local_38,&local_58," of ");
  Catch::Detail::stringify<double>(&local_a8,&this->m_target);
  std::operator+(__return_storage_ptr__,&local_38,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinAbsMatcher::describe() const {
        return "is within " + ::Catch::Detail::stringify(m_margin) + " of " + ::Catch::Detail::stringify(m_target);
    }